

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpparser.c
# Opt level: O0

http_header_t * httpmsg_find_hdr(http_message_t *msg,int header_name_id,memptr *value)

{
  ListNode *pLVar1;
  http_header_t *data;
  ListNode *node;
  http_header_t header;
  memptr *value_local;
  int header_name_id_local;
  http_message_t *msg_local;
  
  header.name.length._0_4_ = header_name_id;
  header.name_buf.size_inc = (size_t)value;
  pLVar1 = ListFind(&msg->headers,(ListNode *)0x0,&node);
  if (pLVar1 == (ListNode *)0x0) {
    msg_local = (http_message_t *)0x0;
  }
  else {
    msg_local = (http_message_t *)pLVar1->item;
    if (header.name_buf.size_inc != 0) {
      *(size_t *)header.name_buf.size_inc = (msg_local->uri).scheme.size;
      *(undefined8 *)(header.name_buf.size_inc + 8) = *(undefined8 *)&(msg_local->uri).path_type;
    }
  }
  return (http_header_t *)msg_local;
}

Assistant:

http_header_t *httpmsg_find_hdr(
	http_message_t *msg, int header_name_id, memptr *value)
{
	http_header_t header; /* temp header for searching */
	ListNode *node;
	http_header_t *data;

	header.name_id = header_name_id;
	node = ListFind(&msg->headers, NULL, &header);
	if (node == NULL) {
		return NULL;
	}
	data = (http_header_t *)node->item;
	if (value != NULL) {
		value->buf = data->value.buf;
		value->length = data->value.length;
	}

	return data;
}